

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O3

string * __thiscall
OpenMD::Revision::getFullRevision_abi_cxx11_(string *__return_storage_ptr__,Revision *this)

{
  char *this_00;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  getVersion_abi_cxx11_(&local_40,this);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this_00 = ", ";
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getRevision_abi_cxx11_(&local_40,(Revision *)this_00);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Revision::getFullRevision() {
    std::string fr;
    fr.assign(getVersion());
    fr.append(", ");
    fr.append(getRevision());
    return fr;
  }